

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

Gia_ResbMan_t * Gia_ResbAlloc(int nWords)

{
  Gia_ResbMan_t *pGVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Wec_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  word *pwVar7;
  Vec_Wrd_t *pVVar8;
  size_t __nmemb;
  
  pGVar1 = (Gia_ResbMan_t *)calloc(1,0xb8);
  pGVar1->nWords = nWords;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pGVar1->vUnateLits[0] = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pGVar1->vUnateLits[1] = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pGVar1->vNotUnateVars[0] = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pGVar1->vNotUnateVars[1] = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pGVar1->vUnatePairs[0] = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pGVar1->vUnatePairs[1] = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pGVar1->vUnateLitsW[0] = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pGVar1->vUnateLitsW[1] = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pGVar1->vUnatePairsW[0] = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pGVar1->vUnatePairsW[1] = pVVar2;
  pVVar4 = (Vec_Wec_t *)malloc(0x10);
  pVVar4->nSize = 0;
  pVVar4->nCap = nWords << 6;
  if (nWords == 0) {
    pVVar2 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar2 = (Vec_Int_t *)calloc((long)(nWords << 6),0x10);
  }
  pVVar4->pArray = pVVar2;
  pGVar1->vSorter = pVVar4;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pGVar1->vBinateVars = pVVar2;
  pVVar2 = (Vec_Int_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  piVar3 = (int *)malloc(400);
  pVVar2->pArray = piVar3;
  pGVar1->vGates = pVVar2;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  pGVar1->vDivs = pVVar5;
  __nmemb = (size_t)nWords;
  pwVar7 = (word *)calloc(__nmemb,8);
  pGVar1->pSets[0] = pwVar7;
  pwVar7 = (word *)calloc(__nmemb,8);
  pGVar1->pSets[1] = pwVar7;
  pwVar7 = (word *)calloc(__nmemb,8);
  pGVar1->pDivA = pwVar7;
  pwVar7 = (word *)calloc(__nmemb,8);
  pGVar1->pDivB = pwVar7;
  pVVar8 = (Vec_Wrd_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  pwVar7 = (word *)malloc(800);
  pVVar8->pArray = pwVar7;
  pGVar1->vSims = pVVar8;
  return pGVar1;
}

Assistant:

Gia_ResbMan_t * Gia_ResbAlloc( int nWords )
{
    Gia_ResbMan_t * p   = ABC_CALLOC( Gia_ResbMan_t, 1 );
    p->nWords           = nWords;
    p->vUnateLits[0]    = Vec_IntAlloc( 100 );
    p->vUnateLits[1]    = Vec_IntAlloc( 100 );
    p->vNotUnateVars[0] = Vec_IntAlloc( 100 );
    p->vNotUnateVars[1] = Vec_IntAlloc( 100 );
    p->vUnatePairs[0]   = Vec_IntAlloc( 100 );
    p->vUnatePairs[1]   = Vec_IntAlloc( 100 );
    p->vUnateLitsW[0]   = Vec_IntAlloc( 100 );
    p->vUnateLitsW[1]   = Vec_IntAlloc( 100 );
    p->vUnatePairsW[0]  = Vec_IntAlloc( 100 );
    p->vUnatePairsW[1]  = Vec_IntAlloc( 100 );
    p->vSorter          = Vec_WecAlloc( nWords*64 );
    p->vBinateVars      = Vec_IntAlloc( 100 );
    p->vGates           = Vec_IntAlloc( 100 );
    p->vDivs            = Vec_PtrAlloc( 100 );
    p->pSets[0]         = ABC_CALLOC( word, nWords );
    p->pSets[1]         = ABC_CALLOC( word, nWords );
    p->pDivA            = ABC_CALLOC( word, nWords );
    p->pDivB            = ABC_CALLOC( word, nWords );
    p->vSims            = Vec_WrdAlloc( 100 );
    return p;
}